

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::initWidgets(QColorDialogPrivate *this)

{
  QLatin1StringView latin1;
  bool bVar1;
  int iVar2;
  QPushButton *pQVar3;
  long *plVar4;
  QVBoxLayout *pQVar5;
  QWellArray *pQVar6;
  QLabel *pQVar7;
  QPushButton *pQVar8;
  offset_in_QColorLuminancePicker_to_subr *slot;
  ContextType *context;
  Object *signal;
  Object *sender;
  QColorLuminancePicker *slot_00;
  QColorShower *pQVar9;
  QDialogButtonBox *pQVar10;
  QColorDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QVBoxLayout *cLay;
  QHBoxLayout *pickLay;
  QVBoxLayout *rightLay;
  int lumSpace;
  QHBoxLayout *topLay;
  QVBoxLayout *mainLay;
  QColorDialog *q;
  code *in_stack_fffffffffffffaf8;
  code *widget;
  ulong uVar11;
  QWidget *pQVar12;
  StandardButton button;
  QVBoxLayout *in_stack_fffffffffffffb00;
  QColorDialogPrivate *pQVar13;
  QBoxLayout *pQVar14;
  QDialogButtonBox *this_00;
  QWidget *in_stack_fffffffffffffb08;
  undefined1 enable;
  QColorWell *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  QFlagsStorage<Qt::WindowType> f;
  undefined8 in_stack_fffffffffffffb20;
  int w;
  Connection *pCVar15;
  QWidget *in_stack_fffffffffffffb28;
  qsizetype in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  QWidget *in_stack_fffffffffffffb48;
  QLabel *in_stack_fffffffffffffb50;
  ConnectionType CVar16;
  Object *sender_00;
  Object *in_stack_fffffffffffffb58;
  Object *receiverPrivate;
  Object *in_stack_fffffffffffffb60;
  Function in_stack_fffffffffffffb80;
  offset_in_QAbstractButton_to_subr in_stack_fffffffffffffb90;
  QColorLuminancePicker *signal_00;
  ConnectionType in_stack_fffffffffffffba0;
  bool local_2e1;
  Connection local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  Connection local_198;
  undefined4 local_190;
  QMargins local_18c;
  undefined1 local_17c [4];
  code *local_178;
  undefined8 local_170;
  Connection local_168;
  QColorDialog *in_stack_fffffffffffffea0;
  QColorShower *in_stack_fffffffffffffea8;
  Connection local_150;
  QMargins local_148;
  code *local_138;
  undefined8 uStack_130;
  Connection local_128;
  offset_in_QColorLuminancePicker_to_subr local_120;
  Connection local_110;
  undefined4 local_104;
  undefined4 local_100;
  undefined1 local_fc [4];
  code *local_f8;
  undefined8 local_f0;
  Connection local_e8;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  Connection local_c8;
  code *local_c0;
  undefined8 uStack_b8;
  Connection local_b0;
  code *local_a8;
  undefined8 uStack_a0;
  Connection local_98;
  code *local_90;
  undefined8 local_88;
  Connection local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_54;
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  code *local_48;
  undefined8 local_40;
  Connection local_38;
  undefined4 local_2c;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  w = (int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  f.i = (Int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar3 = (QPushButton *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(in_stack_fffffffffffffb00,(QWidget *)in_stack_fffffffffffffaf8);
  QLayout::setSizeConstraint
            ((QLayout *)in_stack_fffffffffffffb10,
             (SizeConstraint)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  plVar4 = (long *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)in_stack_fffffffffffffb00);
  QBoxLayout::addLayout
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QLayout *)in_stack_fffffffffffffaf8,0);
  in_RDI->leftLay = (QVBoxLayout *)0x0;
  QGuiApplication::primaryScreen();
  local_18 = QScreen::virtualGeometry();
  iVar2 = QRect::width((QRect *)in_stack_fffffffffffffaf8);
  local_2e1 = true;
  if (0x1df < iVar2) {
    QGuiApplication::primaryScreen();
    local_28 = QScreen::virtualGeometry();
    iVar2 = QRect::height((QRect *)in_stack_fffffffffffffaf8);
    local_2e1 = iVar2 < 0x15e;
  }
  in_RDI->smallDisplay = local_2e1;
  (**(code **)(*plVar4 + 0x60))();
  if ((in_RDI->smallDisplay & 1U) == 0) {
    pQVar5 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout(in_stack_fffffffffffffb00);
    in_RDI->leftLay = pQVar5;
    QBoxLayout::addLayout
              (&in_stack_fffffffffffffb00->super_QBoxLayout,(QLayout *)in_stack_fffffffffffffaf8,0);
    pQVar6 = (QWellArray *)operator_new(0x68);
    QColorDialogOptions::standardColors();
    QtPrivate::QColorWell::QColorWell
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (int)((ulong)in_stack_fffffffffffffb00 >> 0x20),(int)in_stack_fffffffffffffb00,
               (QRgb *)in_stack_fffffffffffffaf8);
    in_RDI->standard = pQVar6;
    pQVar7 = (QLabel *)operator_new(0x28);
    local_2c = 0;
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x73800c);
    QLabel::QLabel((QLabel *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(WindowFlags)f.i);
    in_RDI->lblBasicColors = pQVar7;
    QLabel::setBuddy(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    local_48 = newStandard;
    local_40 = 0;
    widget = newStandard;
    pQVar13 = (QColorDialogPrivate *)0x0;
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb80,(ConnectionType)((ulong)in_stack_fffffffffffffb50 >> 0x20))
    ;
    QMetaObject::Connection::~Connection(&local_38);
    memset(local_4c,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738123);
    QBoxLayout::addWidget
              ((QBoxLayout *)pQVar13,(QWidget *)widget,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
    memset(local_50,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738188);
    QBoxLayout::addWidget
              ((QBoxLayout *)pQVar13,(QWidget *)widget,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
    bVar1 = supportsColorPicking(pQVar13);
    if (bVar1) {
      pQVar8 = (QPushButton *)operator_new(0x28);
      QPushButton::QPushButton((QPushButton *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      in_RDI->eyeDropperButton = pQVar8;
      local_54 = 0;
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73823e);
      QBoxLayout::addWidget
                ((QBoxLayout *)pQVar13,(QWidget *)widget,0,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
      pQVar7 = (QLabel *)operator_new(0x28);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffb08,(size_t)pQVar13);
      latin1.m_data = in_stack_fffffffffffffb38;
      latin1.m_size = in_stack_fffffffffffffb30;
      QString::QString((QString *)in_stack_fffffffffffffb10,latin1);
      local_74 = 0;
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7382d4);
      QLabel::QLabel((QLabel *)in_stack_fffffffffffffb10,(QString *)in_stack_fffffffffffffb08,
                     (QWidget *)pQVar13,(WindowFlags)f.i);
      in_RDI->lblScreenColorInfo = pQVar7;
      QString::~QString((QString *)0x73831c);
      local_78 = 0;
      QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73835a);
      QBoxLayout::addWidget
                ((QBoxLayout *)pQVar13,(QWidget *)widget,0,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
      local_90 = pickScreenColor;
      local_88 = 0;
      widget = pickScreenColor;
      pQVar13 = (QColorDialogPrivate *)0x0;
      QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QColorDialogPrivate::*)()>
                ((Object *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,
                 in_stack_fffffffffffffb58,in_stack_fffffffffffffb80,
                 (ConnectionType)((ulong)in_stack_fffffffffffffb50 >> 0x20));
      QMetaObject::Connection::~Connection(&local_80);
    }
    else {
      in_RDI->eyeDropperButton = (QPushButton *)0x0;
      in_RDI->lblScreenColorInfo = (QLabel *)0x0;
    }
    QBoxLayout::addStretch((QBoxLayout *)pQVar13,(int)((ulong)widget >> 0x20));
    pQVar6 = (QWellArray *)operator_new(0x68);
    QColorDialogOptions::customColors();
    QtPrivate::QColorWell::QColorWell
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(int)((ulong)pQVar13 >> 0x20),
               (int)pQVar13,(QRgb *)widget);
    in_RDI->custom = pQVar6;
    QWidget::setAcceptDrops((QWidget *)pQVar13,SUB81((ulong)widget >> 0x38,0));
    local_a8 = newCustom;
    uStack_a0 = 0;
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb80,(ConnectionType)((ulong)in_stack_fffffffffffffb50 >> 0x20))
    ;
    QMetaObject::Connection::~Connection(&local_98);
    local_c0 = nextCustom;
    uStack_b8 = 0;
    uVar11 = 0;
    pQVar14 = (QBoxLayout *)0x0;
    QObjectPrivate::
    connect<void(QtPrivate::QWellArray::*)(int,int),void(QColorDialogPrivate::*)(int,int)>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,in_stack_fffffffffffffb58,
               in_stack_fffffffffffffb80,(ConnectionType)((ulong)in_stack_fffffffffffffb50 >> 0x20))
    ;
    QMetaObject::Connection::~Connection(&local_b0);
    pQVar12 = (QWidget *)(uVar11 & 0xffffffff00000000);
    QObject::
    connect<void(QtPrivate::QWellArray::*)(int,unsigned_int),QColorDialogPrivate::initWidgets()::__0>
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb80,
               (ContextType *)in_stack_fffffffffffffb58,
               (anon_class_8_1_8991fb9c_for_o *)in_stack_fffffffffffffb50,in_stack_fffffffffffffba0)
    ;
    QMetaObject::Connection::~Connection(&local_c8);
    pQVar7 = (QLabel *)operator_new(0x28);
    local_d4 = 0;
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x73868e);
    QLabel::QLabel((QLabel *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(WindowFlags)f.i);
    in_RDI->lblCustomColors = pQVar7;
    QLabel::setBuddy(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    CVar16 = (ConnectionType)((ulong)in_stack_fffffffffffffb50 >> 0x20);
    local_d8 = 0;
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738712);
    QBoxLayout::addWidget
              (pQVar14,pQVar12,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
    local_dc = 0;
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738773);
    QBoxLayout::addWidget
              (pQVar14,pQVar12,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
    pQVar8 = (QPushButton *)operator_new(0x28);
    QPushButton::QPushButton((QPushButton *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    in_RDI->addCusBt = pQVar8;
    local_f8 = addCustom;
    local_f0 = 0;
    in_stack_fffffffffffffaf8 = addCustom;
    in_stack_fffffffffffffb00 = (QVBoxLayout *)0x0;
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QColorDialogPrivate::*)()>
              ((Object *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb58,in_stack_fffffffffffffb80,CVar16);
    QMetaObject::Connection::~Connection(&local_e8);
    memset(local_fc,0,4);
    QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x73889b);
    QBoxLayout::addWidget
              (&in_stack_fffffffffffffb00->super_QBoxLayout,(QWidget *)in_stack_fffffffffffffaf8,0,
               (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
  }
  else {
    pWidth = 0x96;
    pHeight = 100;
    in_RDI->custom = (QWellArray *)0x0;
    in_RDI->standard = (QWellArray *)0x0;
  }
  sender_00 = (Object *)0x20;
  slot = (offset_in_QColorLuminancePicker_to_subr *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(in_stack_fffffffffffffb00);
  QBoxLayout::addLayout
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QLayout *)in_stack_fffffffffffffaf8,0);
  context = (ContextType *)operator_new((ulong)sender_00);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)in_stack_fffffffffffffb00);
  QBoxLayout::addLayout
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QLayout *)in_stack_fffffffffffffaf8,0);
  signal = (Object *)operator_new((ulong)sender_00);
  QVBoxLayout::QVBoxLayout(in_stack_fffffffffffffb00);
  receiverPrivate = signal;
  QBoxLayout::addLayout
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QLayout *)in_stack_fffffffffffffaf8,0);
  sender = (Object *)operator_new(0x50);
  QtPrivate::QColorPicker::QColorPicker
            ((QColorPicker *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  in_RDI->cp = (QColorPicker *)sender;
  ::operator|((Shape)((ulong)in_stack_fffffffffffffb00 >> 0x20),(Shadow)in_stack_fffffffffffffb00);
  QFrame::setFrameStyle
            ((QFrame *)in_stack_fffffffffffffb10,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  QBoxLayout::addSpacing
            (&in_stack_fffffffffffffb00->super_QBoxLayout,
             (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  local_100 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738a5e);
  QBoxLayout::addWidget
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QWidget *)in_stack_fffffffffffffaf8,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
  QBoxLayout::addSpacing
            (&in_stack_fffffffffffffb00->super_QBoxLayout,
             (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  slot_00 = (QColorLuminancePicker *)operator_new(0x40);
  QtPrivate::QColorLuminancePicker::QColorLuminancePicker
            ((QColorLuminancePicker *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  in_RDI->lp = slot_00;
  QWidget::setFixedWidth(in_stack_fffffffffffffb28,w);
  QBoxLayout::addSpacing
            (&in_stack_fffffffffffffb00->super_QBoxLayout,
             (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  signal_00 = in_RDI->lp;
  local_104 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738b2d);
  QBoxLayout::addWidget
            (&in_stack_fffffffffffffb00->super_QBoxLayout,(QWidget *)in_stack_fffffffffffffaf8,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
  QBoxLayout::addStretch
            (&in_stack_fffffffffffffb00->super_QBoxLayout,
             (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
  local_120 = QNonConstOverload<int,int>::operator()
                        ((QNonConstOverload<int,int> *)&qOverload<int,int>,0x732960);
  QObject::
  connect<void(QtPrivate::QColorPicker::*)(int,int),void(QtPrivate::QColorLuminancePicker::*)(int,int)>
            ((Object *)sender_00,(offset_in_QColorPicker_to_subr)signal,context,slot,
             (ConnectionType)signal_00);
  QMetaObject::Connection::~Connection(&local_110);
  local_138 = newHsv;
  uStack_130 = 0;
  iVar2 = 0;
  pQVar14 = (QBoxLayout *)0x0;
  QObjectPrivate::
  connect<void(QtPrivate::QColorLuminancePicker::*)(int,int,int),void(QColorDialogPrivate::*)(int,int,int)>
            ((Object *)sender,(offset_in_QColorLuminancePicker_to_subr)signal_00,receiverPrivate,
             (Function)slot_00,(ConnectionType)((ulong)sender_00 >> 0x20));
  QMetaObject::Connection::~Connection(&local_128);
  QBoxLayout::addStretch(pQVar14,iVar2);
  pQVar9 = (QColorShower *)operator_new(0xe8);
  QtPrivate::QColorShower::QColorShower(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  in_RDI->cs = pQVar9;
  local_148 = QLayout::contentsMargins((QLayout *)in_stack_fffffffffffffb08);
  QLayout::setContentsMargins
            ((QLayout *)in_stack_fffffffffffffb10,(QMargins *)in_stack_fffffffffffffb08);
  uVar11 = 0;
  this_00 = (QDialogButtonBox *)0x0;
  QObjectPrivate::
  connect<void(QtPrivate::QColorShower::*)(unsigned_int),void(QColorDialogPrivate::*)(unsigned_int)>
            (sender,(offset_in_QColorShower_to_subr)signal_00,receiverPrivate,(Function)slot_00,
             (ConnectionType)((ulong)sender_00 >> 0x20));
  CVar16 = (ConnectionType)signal_00;
  QMetaObject::Connection::~Connection(&local_150);
  local_178 = QColorDialog::currentColorChanged;
  local_170 = 0;
  pQVar12 = (QWidget *)(uVar11 & 0xffffffff00000000);
  QObject::
  connect<void(QtPrivate::QColorShower::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            (sender_00,(offset_in_QColorShower_to_subr)signal,(ContextType *)context,slot,CVar16);
  QMetaObject::Connection::~Connection(&local_168);
  memset(local_17c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738ebe);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,pQVar12,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_fffffffffffffb08 >> 0x20,0));
  if (in_RDI->leftLay != (QVBoxLayout *)0x0) {
    local_18c = QLayout::contentsMargins((QLayout *)in_stack_fffffffffffffb08);
    QMargins::right((QMargins *)0x738f32);
    QBoxLayout::addSpacing((QBoxLayout *)this_00,(int)((ulong)pQVar12 >> 0x20));
  }
  pQVar10 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(this_00,pQVar12);
  in_RDI->buttons = pQVar10;
  pQVar13 = (QColorDialogPrivate *)in_RDI->buttons;
  local_190 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x738fa2);
  QBoxLayout::addWidget
            ((QBoxLayout *)this_00,pQVar12,0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)pQVar10 >> 0x20,0));
  enable = (undefined1)((ulong)pQVar10 >> 0x38);
  button = (StandardButton)((ulong)pQVar12 >> 0x20);
  pQVar8 = QDialogButtonBox::addButton(this_00,button);
  in_RDI->ok = pQVar8;
  local_1a0 = 0;
  local_1a8 = 0x1b9;
  pCVar15 = &local_198;
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            ((Object *)sender_00,(offset_in_QAbstractButton_to_subr)signal,(ContextType *)context,
             slot,CVar16);
  QMetaObject::Connection::~Connection(pCVar15);
  QPushButton::setDefault(pQVar3,(bool)enable);
  pQVar3 = QDialogButtonBox::addButton(this_00,button);
  in_RDI->cancel = pQVar3;
  pCVar15 = &local_1b0;
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            ((Object *)sender_00,(offset_in_QAbstractButton_to_subr)signal,(ContextType *)context,
             slot,CVar16);
  QMetaObject::Connection::~Connection(pCVar15);
  retranslateStrings(pQVar13);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initWidgets()
{
    Q_Q(QColorDialog);
    QVBoxLayout *mainLay = new QVBoxLayout(q);
    // there's nothing in this dialog that benefits from sizing up
    mainLay->setSizeConstraint(QLayout::SetFixedSize);

    QHBoxLayout *topLay = new QHBoxLayout();
    mainLay->addLayout(topLay);

    leftLay = nullptr;

#if defined(QT_SMALL_COLORDIALOG)
    smallDisplay = true;
    const int lumSpace = 20;
#else
    // small displays (e.g. PDAs) cannot fit the full color dialog,
    // so just use the color picker.
    smallDisplay = (QGuiApplication::primaryScreen()->virtualGeometry().width() < 480 || QGuiApplication::primaryScreen()->virtualGeometry().height() < 350);
    const int lumSpace = topLay->spacing() / 2;
#endif

    if (!smallDisplay) {
        leftLay = new QVBoxLayout;
        topLay->addLayout(leftLay);

        standard = new QColorWell(q, standardColorRows, colorColumns, QColorDialogOptions::standardColors());
        lblBasicColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblBasicColors->setBuddy(standard);
#endif
        QObjectPrivate::connect(standard, &QColorWell::selected,
                                this, &QColorDialogPrivate::newStandard);
        leftLay->addWidget(lblBasicColors);
        leftLay->addWidget(standard);

#if !defined(QT_SMALL_COLORDIALOG)
        if (supportsColorPicking()) {
            eyeDropperButton = new QPushButton();
            leftLay->addWidget(eyeDropperButton);
            lblScreenColorInfo = new QLabel("\n"_L1);
            leftLay->addWidget(lblScreenColorInfo);
            QObjectPrivate::connect(eyeDropperButton, &QPushButton::clicked,
                                    this, &QColorDialogPrivate::pickScreenColor);
        } else {
            eyeDropperButton = nullptr;
            lblScreenColorInfo = nullptr;
        }
#endif

        leftLay->addStretch();

        custom = new QColorWell(q, customColorRows, colorColumns, QColorDialogOptions::customColors());
        custom->setAcceptDrops(true);

        QObjectPrivate::connect(custom, &QColorWell::selected, this, &QColorDialogPrivate::newCustom);
        QObjectPrivate::connect(custom, &QColorWell::currentChanged, this, &QColorDialogPrivate::nextCustom);

        QObject::connect(custom, &QWellArray::colorChanged, q, [this] (int index, QRgb color) {
            QColorDialogOptions::setCustomColor(index, color);
            if (custom)
                custom->update();
        });

        lblCustomColors = new QLabel(q);
#ifndef QT_NO_SHORTCUT
        lblCustomColors->setBuddy(custom);
#endif
        leftLay->addWidget(lblCustomColors);
        leftLay->addWidget(custom);

        addCusBt = new QPushButton(q);
        QObjectPrivate::connect(addCusBt, &QPushButton::clicked, this, &QColorDialogPrivate::addCustom);
        leftLay->addWidget(addCusBt);
    } else {
        // better color picker size for small displays
#if defined(QT_SMALL_COLORDIALOG)
        QSize screenSize = QGuiApplication::screenAt(QCursor::pos())->availableGeometry().size();
        pWidth = pHeight = qMin(screenSize.width(), screenSize.height());
        pHeight -= 20;
        if (screenSize.height() > screenSize.width())
            pWidth -= 20;
#else
        pWidth = 150;
        pHeight = 100;
#endif
        custom = nullptr;
        standard = nullptr;
    }

    QVBoxLayout *rightLay = new QVBoxLayout;
    topLay->addLayout(rightLay);

    QHBoxLayout *pickLay = new QHBoxLayout;
    rightLay->addLayout(pickLay);

    QVBoxLayout *cLay = new QVBoxLayout;
    pickLay->addLayout(cLay);
    cp = new QColorPicker(q);

    cp->setFrameStyle(QFrame::Panel | QFrame::Sunken);

#if defined(QT_SMALL_COLORDIALOG)
    cp->hide();
#else
    cLay->addSpacing(lumSpace);
    cLay->addWidget(cp);
#endif
    cLay->addSpacing(lumSpace);

    lp = new QColorLuminancePicker(q);
#if defined(QT_SMALL_COLORDIALOG)
    lp->hide();
#else
    lp->setFixedWidth(20);
    pickLay->addSpacing(10);
    pickLay->addWidget(lp);
    pickLay->addStretch();
#endif

    QObject::connect(cp, &QColorPicker::newCol, lp, qOverload<int, int>(&QColorLuminancePicker::setCol));
    QObjectPrivate::connect(lp, &QColorLuminancePicker::newHsv, this, &QColorDialogPrivate::newHsv);

    rightLay->addStretch();

    cs = new QColorShower(q);
    pickLay->setContentsMargins(cs->gl->contentsMargins());
    QObjectPrivate::connect(cs, &QColorShower::newCol,
                            this, &QColorDialogPrivate::newColorTypedIn);
    QObject::connect(cs, &QColorShower::currentColorChanged,
                     q, &QColorDialog::currentColorChanged);
#if defined(QT_SMALL_COLORDIALOG)
    topLay->addWidget(cs);
#else
    rightLay->addWidget(cs);
    if (leftLay)
        leftLay->addSpacing(cs->gl->contentsMargins().right());
#endif

    buttons = new QDialogButtonBox(q);
    mainLay->addWidget(buttons);

    ok = buttons->addButton(QDialogButtonBox::Ok);
    QObject::connect(ok, &QPushButton::clicked, q, &QColorDialog::accept);
    ok->setDefault(true);
    cancel = buttons->addButton(QDialogButtonBox::Cancel);
    QObject::connect(cancel, &QPushButton::clicked, q, &QColorDialog::reject);

#ifdef Q_OS_WIN32
    updateTimer = new QTimer(q);
    QObjectPrivate::connect(updateTimer, &QTimer::timeout,
                            this, qOverload<>(&QColorDialogPrivate::updateColorPicking));
#endif
    retranslateStrings();
}